

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_prefixes.c
# Opt level: O0

void PrefSEGCS(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  iVar1 = Security(2,pMyDisasm);
  if (iVar1 != 0) {
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    ResetREX(pMyDisasm);
    (pMyDisasm->Prefix).CSPrefix = '\x01';
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
    (pMyDisasm->Reserved_).NB_PREFIX = (pMyDisasm->Reserved_).NB_PREFIX + 1;
    (pMyDisasm->Instruction).Opcode = (uint)*(byte *)(pMyDisasm->Reserved_).EIP_;
    (*opcode_map1[*(byte *)(pMyDisasm->Reserved_).EIP_])(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ PrefSEGCS(PDISASM pMyDisasm)
{
    if (!Security(2, pMyDisasm)) return;
    if (GV.VEX.state == InUsePrefix) GV.ERROR_OPCODE = UD_;
    ResetREX(pMyDisasm);
    pMyDisasm->Prefix.CSPrefix = InUsePrefix;
    GV.EIP_++;
    pMyDisasm->Prefix.Number++;
    GV.NB_PREFIX++;
    pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
    (void) opcode_map1[*((UInt8*) GV.EIP_)](pMyDisasm);
}